

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Parser::_scan_squot_scalar(Parser *this)

{
  ulong uVar1;
  State *pSVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  byte bVar13;
  uint uVar14;
  bool bVar15;
  long lVar16;
  char *pcVar17;
  basic_substring<char> *pbVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  byte bVar26;
  csubstr cVar27;
  basic_substring<char> bVar28;
  char msg [41];
  basic_substring<char> local_1f8;
  basic_substring<char> local_1e8;
  char local_1d8 [48];
  undefined4 local_1a8;
  undefined1 local_1a4;
  size_t local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar26 = 0;
  uVar22 = (this->m_state->pos).super_LineCol.offset;
  if ((this->m_buf).len < uVar22) {
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    handle_error(0x1fc017,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            (&local_1e8,(this->m_buf).str + uVar22,(this->m_buf).len - uVar22);
  local_1f8 = local_1e8;
  if ((local_1e8.len != 0) && (*local_1e8.str == ' ')) {
    local_1f8 = basic_substring<char>::triml(&local_1f8,' ');
    if ((this->m_buf).len < uVar22) {
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        cVar27 = (csubstr)(*pcVar3)();
        return cVar27;
      }
      handle_error(0x1fc017,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              (&local_1e8,(this->m_buf).str + uVar22,(this->m_buf).len - uVar22);
    if (local_1e8.len == 0) {
      if (local_1f8.len == 0) {
        bVar15 = local_1e8.str != (char *)0x0 && local_1e8.str == local_1f8.str;
        goto LAB_001de353;
      }
LAB_001de35b:
      builtin_strncpy(local_1d8 + 0x10,"uper(s))",9);
      builtin_strncpy(local_1d8,"_buf.sub(b).is_s",0x10);
      local_1e8.len._0_1_ = 'i';
      local_1e8.len._1_1_ = 'l';
      local_1e8.len._2_1_ = 'e';
      local_1e8.len._3_1_ = 'd';
      local_1e8.len._4_1_ = ':';
      local_1e8.len._5_1_ = ' ';
      local_1e8.len._6_1_ = '(';
      local_1e8.len._7_1_ = 'm';
      local_1e8.str = (char *)0x6166206b63656863;
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        cVar27 = (csubstr)(*pcVar3)();
        return cVar27;
      }
      local_58 = 0;
      uStack_50 = 0x7a14;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7a14) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x7a14) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1e8,0x29,LVar4,(this->m_stack).m_callbacks.m_user_data);
    }
    else {
      bVar15 = local_1f8.str + local_1f8.len <= local_1e8.str + local_1e8.len &&
               local_1e8.str <= local_1f8.str;
LAB_001de353:
      if (!bVar15) goto LAB_001de35b;
    }
    pcVar17 = local_1f8.str;
    if ((this->m_buf).len < uVar22) {
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        cVar27 = (csubstr)(*pcVar3)();
        return cVar27;
      }
      handle_error(0x1fc017,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              (&local_1e8,(this->m_buf).str + uVar22,(this->m_buf).len - uVar22);
    if (pcVar17 < local_1e8.str) {
      builtin_strncpy(local_1d8 + 0x10,"f.sub(b).begin())",0x12);
      builtin_strncpy(local_1d8,".begin() >= m_bu",0x10);
      local_1e8.len._0_1_ = 'i';
      local_1e8.len._1_1_ = 'l';
      local_1e8.len._2_1_ = 'e';
      local_1e8.len._3_1_ = 'd';
      local_1e8.len._4_1_ = ':';
      local_1e8.len._5_1_ = ' ';
      local_1e8.len._6_1_ = '(';
      local_1e8.len._7_1_ = 's';
      local_1e8.str = (char *)0x6166206b63656863;
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        cVar27 = (csubstr)(*pcVar3)();
        return cVar27;
      }
      local_80 = 0;
      uStack_78 = 0x7a15;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7a15) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x7a15) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1e8,0x32,LVar5,(this->m_stack).m_callbacks.m_user_data);
    }
    pcVar17 = local_1f8.str;
    if ((this->m_buf).len < uVar22) {
      if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar3 = (code *)swi(3);
        cVar27 = (csubstr)(*pcVar3)();
        return cVar27;
      }
      handle_error(0x1fc017,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              (&local_1e8,(this->m_buf).str + uVar22,(this->m_buf).len - uVar22);
    _line_progressed(this,(long)pcVar17 - (long)local_1e8.str);
  }
  local_1a0 = (this->m_state->pos).super_LineCol.offset;
  if ((local_1f8.len == 0) || (*local_1f8.str != '\'')) {
    builtin_strncpy(local_1d8,".begins_with(\'\\\'\'))",0x14);
    local_1e8.len._0_1_ = 'i';
    local_1e8.len._1_1_ = 'l';
    local_1e8.len._2_1_ = 'e';
    local_1e8.len._3_1_ = 'd';
    local_1e8.len._4_1_ = ':';
    local_1e8.len._5_1_ = ' ';
    local_1e8.len._6_1_ = '(';
    local_1e8.len._7_1_ = 's';
    local_1e8.str = (char *)0x6166206b63656863;
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    local_a8 = 0;
    uStack_a0 = 0x7a19;
    local_98 = 0;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_88 = 0x65;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7a19) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x7a19) << 0x40,8);
    LVar6.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1e8,0x24,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  _line_progressed(this,1);
  if (local_1f8.len == 0) {
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    handle_error(0x1fc017,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring(&local_1e8,local_1f8.str + 1,local_1f8.len - 1);
  local_1f8 = local_1e8;
  local_1a0 = ~local_1a0;
  uVar20 = 1;
  bVar15 = false;
  uVar22 = 0xffffffffffffffff;
  do {
    pSVar2 = this->m_state;
    uVar23 = (this->m_buf).len;
    uVar24 = uVar22;
    if (uVar23 <= (pSVar2->pos).super_LineCol.offset) break;
    pcVar17 = (pSVar2->line_contents).rem.str;
    uVar24 = (pSVar2->line_contents).rem.len;
    bVar13 = 1;
    if (uVar24 != 0) {
      uVar19 = 0;
      uVar21 = uVar22;
      bVar13 = 1;
      do {
        if (pcVar17[uVar19] == ' ') {
LAB_001de6b3:
          bVar25 = true;
          uVar22 = uVar21;
        }
        else {
          if (pcVar17[uVar19] != '\'') {
            bVar13 = 0;
            goto LAB_001de6b3;
          }
          uVar1 = uVar19 + 1;
          if (uVar1 < uVar24) {
            bVar25 = pcVar17[uVar1] == '\'';
          }
          else {
            bVar25 = false;
          }
          uVar22 = uVar19;
          if (bVar25) {
            bVar15 = true;
            uVar19 = uVar1;
            uVar22 = uVar21;
          }
        }
      } while ((bVar25) && (uVar19 = uVar19 + 1, uVar21 = uVar22, uVar19 < uVar24));
    }
    bVar25 = (bool)(bVar13 | bVar15);
    bVar15 = true;
    if ((!bVar25 && uVar20 < 2) &&
       ((bVar15 = false, uVar24 != 0 && (pcVar17 == (pSVar2->line_contents).full.str)))) {
      bVar15 = *pcVar17 == ' ';
    }
    if (uVar22 == 0xffffffffffffffff) {
      _line_progressed(this,uVar24);
      uVar20 = uVar20 + 1;
      _line_ended(this);
      _scan_line(this);
      uVar24 = 0xffffffffffffffff;
    }
    else {
      if (uVar23 <= uVar22) {
        builtin_strncpy(local_1d8 + 0x10," m_buf.len)",0xc);
        builtin_strncpy(local_1d8,"os >= 0 && pos <",0x10);
        local_1e8.len._0_1_ = 'i';
        local_1e8.len._1_1_ = 'l';
        local_1e8.len._2_1_ = 'e';
        local_1e8.len._3_1_ = 'd';
        local_1e8.len._4_1_ = ':';
        local_1e8.len._5_1_ = ' ';
        local_1e8.len._6_1_ = '(';
        local_1e8.len._7_1_ = 'p';
        local_1e8.str = (char *)0x6166206b63656863;
        if (((s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
          pcVar3 = (code *)swi(3);
          cVar27 = (csubstr)(*pcVar3)();
          return cVar27;
        }
        local_d0 = 0;
        uStack_c8 = 0x7a4c;
        local_c0 = 0;
        pcStack_b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_b0 = 0x65;
        LVar7.super_LineCol.col = 0;
        LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7a4c) << 0x40,0);
        LVar7.super_LineCol.line = SUB168(ZEXT816(0x7a4c) << 0x40,8);
        LVar7.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar7.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1e8,0x2c,LVar7,(this->m_stack).m_callbacks.m_user_data);
      }
      uVar23 = (this->m_state->pos).super_LineCol.offset + uVar22;
      if ((this->m_buf).len <= uVar23) {
        if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          cVar27 = (csubstr)(*pcVar3)();
          return cVar27;
        }
        handle_error(0x1fc017,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      if ((this->m_buf).str[uVar23] != '\'') {
        builtin_strncpy(local_1d8 + 0x10,"s.offset + pos] == \'\\\'\')",0x19);
        builtin_strncpy(local_1d8,"_buf[m_state->po",0x10);
        local_1e8.len._0_1_ = 'i';
        local_1e8.len._1_1_ = 'l';
        local_1e8.len._2_1_ = 'e';
        local_1e8.len._3_1_ = 'd';
        local_1e8.len._4_1_ = ':';
        local_1e8.len._5_1_ = ' ';
        local_1e8.len._6_1_ = '(';
        local_1e8.len._7_1_ = 'm';
        local_1e8.str = (char *)0x6166206b63656863;
        if (((s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
          pcVar3 = (code *)swi(3);
          cVar27 = (csubstr)(*pcVar3)();
          return cVar27;
        }
        local_f8 = 0;
        uStack_f0 = 0x7a4d;
        local_e8 = 0;
        pcStack_e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d8 = 0x65;
        LVar8.super_LineCol.col = 0;
        LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7a4d) << 0x40,0);
        LVar8.super_LineCol.line = SUB168(ZEXT816(0x7a4d) << 0x40,8);
        LVar8.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar8.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1e8,0x39,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
      _line_progressed(this,uVar22 + 1);
      uVar24 = (this->m_state->pos).super_LineCol.offset + local_1a0;
    }
    bVar25 = uVar22 == 0xffffffffffffffff;
    uVar22 = uVar24;
  } while (bVar25);
  if (uVar24 == 0) {
    local_1e8.len._0_1_ = 'i';
    local_1e8.len._1_1_ = 'l';
    local_1e8.len._2_1_ = 'e';
    local_1e8.len._3_1_ = 'd';
    local_1e8.len._4_1_ = ':';
    local_1e8.len._5_1_ = ' ';
    local_1e8.len._6_1_ = '(';
    local_1e8.len._7_1_ = 'p';
    local_1e8.str = (char *)0x6166206b63656863;
    builtin_strncpy(local_1d8,"os > 0)",8);
    if (((s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    local_120 = 0;
    uStack_118 = 0x7a5d;
    local_110 = 0;
    pcStack_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_100 = 0x65;
    LVar9.super_LineCol.col = 0;
    LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7a5d) << 0x40,0);
    LVar9.super_LineCol.line = SUB168(ZEXT816(0x7a5d) << 0x40,8);
    LVar9.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar9.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1e8,0x18,LVar9,(this->m_stack).m_callbacks.m_user_data);
  }
  else if (uVar24 == 0xffffffffffffffff) {
    bVar25 = is_debugger_attached();
    if ((bVar25) && (bVar25 = is_debugger_attached(), bVar25)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    cVar27.len = 0x3a;
    cVar27.str = "ERROR: reached end of file while looking for closing quote";
    _err<>(this,cVar27);
    goto LAB_001dec1f;
  }
  pcVar17 = (this->m_buf).str;
  if ((local_1f8.str + local_1f8.len < pcVar17) ||
     (pcVar17 + (this->m_buf).len < local_1f8.str + local_1f8.len)) {
    pcVar17 = "check failed: (s.end() >= m_buf.begin() && s.end() <= m_buf.end())";
    pbVar18 = &local_1e8;
    for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
      pbVar18->str = *(char **)pcVar17;
      pcVar17 = pcVar17 + ((ulong)bVar26 * -2 + 1) * 8;
      pbVar18 = (basic_substring<char> *)&pbVar18[-(ulong)bVar26].len;
    }
    uVar14 = (uint)local_1a8 >> 0x10;
    local_1a8 = CONCAT22((ushort)uVar14 & 0xff00,0x2929);
    if (((s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    local_148 = 0;
    uStack_140 = 0x7a5e;
    local_138 = 0;
    pcStack_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_128 = 0x65;
    LVar10.super_LineCol.col = 0;
    LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7a5e) << 0x40,0);
    LVar10.super_LineCol.line = SUB168(ZEXT816(0x7a5e) << 0x40,8);
    LVar10.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar10.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1e8,0x43,LVar10,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((local_1f8.str + local_1f8.len != (this->m_buf).str + (this->m_buf).len) &&
     (local_1f8.str[local_1f8.len] != '\'')) {
    builtin_strncpy(local_1d8 + 0x10,"end() || *s.end() == \'\\\'\')",0x1b);
    builtin_strncpy(local_1d8,".end() == m_buf.",0x10);
    local_1e8.len._0_1_ = 'i';
    local_1e8.len._1_1_ = 'l';
    local_1e8.len._2_1_ = 'e';
    local_1e8.len._3_1_ = 'd';
    local_1e8.len._4_1_ = ':';
    local_1e8.len._5_1_ = ' ';
    local_1e8.len._6_1_ = '(';
    local_1e8.len._7_1_ = 's';
    local_1e8.str = (char *)0x6166206b63656863;
    if (((s_error_flags & 1) != 0) && (bVar25 = is_debugger_attached(), bVar25)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    local_170 = 0;
    uStack_168 = 0x7a5f;
    local_160 = 0;
    pcStack_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_150 = 0x65;
    LVar11.super_LineCol.col = 0;
    LVar11.super_LineCol.offset = SUB168(ZEXT816(0x7a5f) << 0x40,0);
    LVar11.super_LineCol.line = SUB168(ZEXT816(0x7a5f) << 0x40,8);
    LVar11.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar11.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1e8,0x3b,LVar11,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar22 = uVar24 - 1;
  if ((uVar24 != 0) && (local_1f8.len < uVar22)) {
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    handle_error(0x1fc017,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  uVar20 = uVar22;
  if (uVar24 == 0) {
    uVar20 = local_1f8.len;
  }
  if (uVar22 != 0 && local_1f8.len < uVar20) {
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar3 = (code *)swi(3);
      cVar27 = (csubstr)(*pcVar3)();
      return cVar27;
    }
    handle_error(0x1fc017,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<char>::basic_substring(&local_1e8,local_1f8.str,uVar20);
  local_1f8 = local_1e8;
LAB_001dec1f:
  cVar27 = (csubstr)local_1f8;
  if (bVar15) {
    cVar27 = _filter_squot_scalar(this,local_1f8);
    if (((local_1f8.len < cVar27.len) && (local_1f8.len != 0)) && (local_1f8.str != (char *)0x0)) {
      local_1e8 = basic_substring<char>::triml(&local_1f8,' ');
      bVar28 = basic_substring<char>::trimr(&local_1e8,' ');
      if (bVar28.str != (char *)0x0 && bVar28.len != 0) {
        pcVar17 = "check failed: (ret.len <= s.len || s.empty() || s.trim(\' \').empty())";
        pbVar18 = &local_1e8;
        for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
          pbVar18->str = *(char **)pcVar17;
          pcVar17 = pcVar17 + ((ulong)bVar26 * -2 + 1) * 8;
          pbVar18 = (basic_substring<char> *)&pbVar18[-(ulong)bVar26].len;
        }
        local_1a4 = 0;
        local_1a8 = 0x29292879;
        if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar3 = (code *)swi(3);
          cVar27 = (csubstr)(*pcVar3)();
          return cVar27;
        }
        local_198 = 0;
        uStack_190 = 0x7a66;
        local_188 = 0;
        pcStack_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_178 = 0x65;
        LVar12.super_LineCol.col = 0;
        LVar12.super_LineCol.offset = SUB168(ZEXT816(0x7a66) << 0x40,0);
        LVar12.super_LineCol.line = SUB168(ZEXT816(0x7a66) << 0x40,8);
        LVar12.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar12.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1e8,0x45,LVar12,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  return cVar27;
}

Assistant:

csubstr Parser::_scan_squot_scalar()
{
    // quoted scalars can spread over multiple lines!
    // nice explanation here: http://yaml-multiline.info/

    // a span to the end of the file
    size_t b = m_state->pos.offset;
    substr s = m_buf.sub(b);
    if(s.begins_with(' '))
    {
        s = s.triml(' ');
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.sub(b).is_super(s));
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begin() >= m_buf.sub(b).begin());
        _line_progressed((size_t)(s.begin() - m_buf.sub(b).begin()));
    }
    b = m_state->pos.offset; // take this into account
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('\''));

    // skip the opening quote
    _line_progressed(1);
    s = s.sub(1);

    bool needs_filter = false;

    size_t numlines = 1; // we already have one line
    size_t pos = npos; // find the pos of the matching quote
    while( ! _finished_file())
    {
        const csubstr line = m_state->line_contents.rem;
        bool line_is_blank = true;
        _c4dbgpf("scanning single quoted scalar @ line[{}]: ~~~{}~~~", m_state->pos.line, line);
        for(size_t i = 0; i < line.len; ++i)
        {
            const char curr = line.str[i];
            if(curr == '\'') // single quotes are escaped with two single quotes
            {
                const char next = i+1 < line.len ? line.str[i+1] : '~';
                if(next != '\'') // so just look for the first quote
                {                // without another after it
                    pos = i;
                    break;
                }
                else
                {
                    needs_filter = true; // needs filter to remove escaped quotes
                    ++i; // skip the escaped quote
                }
            }
            else if(curr != ' ')
            {
                line_is_blank = false;
            }
        }

        // leading whitespace also needs filtering
        needs_filter = needs_filter
            || (numlines > 1)
            || line_is_blank
            || (_at_line_begin() && line.begins_with(' '));

        if(pos == npos)
        {
            _line_progressed(line.len);
            ++numlines;
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos >= 0 && pos < m_buf.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf[m_state->pos.offset + pos] == '\'');
            _line_progressed(pos + 1); // progress beyond the quote
            pos = m_state->pos.offset - b - 1; // but we stop before it
            break;
        }

        _line_ended();
        _scan_line();
    }

    if(pos == npos)
    {
        _c4err("reached end of file while looking for closing quote");
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, pos > 0);
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() && s.end() <= m_buf.end());
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() == m_buf.end() || *s.end() == '\'');
        s = s.sub(0, pos-1);
    }

    if(needs_filter)
    {
        csubstr ret = _filter_squot_scalar(s);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ret.len <= s.len || s.empty() || s.trim(' ').empty());
        _c4dbgpf("final scalar: \"{}\"", ret);
        return ret;
    }

    _c4dbgpf("final scalar: \"{}\"", s);

    return s;
}